

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall despot::Parser::PrintObs(Parser *this,OBS_TYPE obs,ostream *out)

{
  pointer pNVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  pointer *ppbVar9;
  ulong uVar10;
  vector<int,_std::allocator<int>_> obs_vec;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             ((long)(this->obs_vars_).
                    super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->obs_vars_).
                    super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x1111111111111111,&local_49);
  pNVar1 = (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (int)((ulong)((long)(this->obs_vars_).
                              super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 3) *
          -0x11111111 - 1;
  if (-1 < (int)uVar5) {
    ppbVar9 = (pointer *)
              ((long)&pNVar1[uVar5].super_Variable.values_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 8);
    lVar6 = (ulong)uVar5 + 1;
    do {
      uVar10 = (ulong)(int)((ulong)((long)*ppbVar9 -
                                   (long)((_Vector_impl_data *)(ppbVar9 + -1))->_M_start) >> 5);
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + -1] = (int)(obs % uVar10);
      ppbVar9 = ppbVar9 + -0xf;
      lVar7 = lVar6 + -1;
      bVar2 = 0 < lVar6;
      lVar6 = lVar7;
      obs = obs / uVar10;
    } while (lVar7 != 0 && bVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  if ((this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar10 = 0;
    do {
      pcVar8 = ", ";
      if (lVar6 == 0) {
        pcVar8 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,(ulong)((uint)(lVar6 != 0) * 2))
      ;
      pNVar1 = (this->obs_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,*(char **)((long)&(pNVar1->name_)._M_dataplus._M_p + lVar6),
                          *(long *)((long)&(pNVar1->name_)._M_string_length + lVar6));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      lVar7 = *(long *)((long)&(((this->obs_vars_).
                                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_Variable).values_
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       + lVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,*(char **)(lVar7 + (long)local_48.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[uVar10] *
                                           0x20),
                 *(long *)(lVar7 + 8 +
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar10] * 0x20));
      uVar10 = uVar10 + 1;
      uVar4 = ((long)(this->obs_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(this->obs_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      lVar6 = lVar6 + 0x78;
    } while (uVar10 <= uVar4 && uVar4 - uVar10 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Parser::PrintObs(OBS_TYPE obs, ostream& out) const {
	vector<int> obs_vec(obs_vars_.size());
	for (int o = obs_vars_.size() - 1; o >= 0; o--) {
		obs_vec[o] = obs % obs_vars_[o].Size();
		obs /= obs_vars_[o].Size();
	}

	out << "[";
	for (int o = 0; o < obs_vars_.size(); o++) {
		out << (o == 0 ? "" : ", ") << obs_vars_[o].name() << ":"
			<< obs_vars_[o].GetValue(obs_vec[o]);
	}
	out << "]" << endl;
}